

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.h
# Opt level: O2

void __thiscall
HighsMipSolverData::HighsMipSolverData(HighsMipSolverData *this,HighsMipSolver *mipsolver)

{
  HighsDomain *this_00;
  vector<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_> *pvVar1;
  vector<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  *pvVar2;
  vector<char,_std::allocator<char>_> *pvVar3;
  vector<long,_std::allocator<long>_> *pvVar4;
  
  this->mipsolver = mipsolver;
  HighsCutPool::HighsCutPool
            (&this->cutpool,mipsolver->model_->num_col_,
             (mipsolver->options_mip_->super_HighsOptionsStruct).mip_pool_age_limit,
             (mipsolver->options_mip_->super_HighsOptionsStruct).mip_pool_soft_limit);
  HighsConflictPool::HighsConflictPool
            (&this->conflictPool,
             (mipsolver->options_mip_->super_HighsOptionsStruct).mip_pool_age_limit * 5,
             (mipsolver->options_mip_->super_HighsOptionsStruct).mip_pool_soft_limit);
  this_00 = &this->domain;
  HighsDomain::HighsDomain(this_00,mipsolver);
  HighsLpRelaxation::HighsLpRelaxation(&this->lp,mipsolver);
  memset(&this->pseudocost,0,0x168);
  HighsCliqueTable::HighsCliqueTable(&this->cliquetable,mipsolver->model_->num_col_);
  HighsImplications::HighsImplications(&this->implications,mipsolver);
  HighsPrimalHeuristics::HighsPrimalHeuristics(&this->heuristics,mipsolver);
  pvVar2 = &(this->redcostfixing).lurkingColLower;
  (pvVar2->
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->redcostfixing).lurkingColUpper.
    super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar2 = &(this->redcostfixing).lurkingColUpper;
  (pvVar2->
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar2->
  super__Vector_base<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>,_std::allocator<std::multimap<double,_int,_std::less<double>,_std::allocator<std::pair<const_double,_int>_>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  HighsObjectiveFunction::HighsObjectiveFunction(&this->objectiveFunction,mipsolver);
  pvVar3 = &(this->postSolveStack).reductionValues.data;
  (pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->postSolveStack).debug_prev_row_upper = 0.0;
  (this->postSolveStack).reductionValues.data.super__Vector_base<char,_std::allocator<char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->postSolveStack).debug_prev_col_upper = 0.0;
  (this->postSolveStack).debug_prev_row_lower = 0.0;
  (this->postSolveStack).debug_prev_numreductions = 0;
  (this->postSolveStack).debug_prev_col_lower = 0.0;
  memset(&(this->postSolveStack).reductions,0,0x90);
  (this->postSolveStack).origNumCol = -1;
  (this->postSolveStack).origNumRow = -1;
  this->presolve_status = kNotSet;
  HighsLp::HighsLp(&this->presolvedModel);
  this->cliquesExtracted = false;
  this->rowMatrixSet = false;
  this->analyticCenterComputed = false;
  this->analyticCenterStatus = kMin;
  this->detectSymmetries = false;
  this->numRestarts = 0;
  this->numRestartsRoot = 0;
  this->numCliqueEntriesAfterPresolve = 0;
  this->numCliqueEntriesAfterFirstPresolve = 0;
  memset(&this->ARstart_,0,0x108);
  HighsSymmetries::HighsSymmetries(&this->symmetries);
  (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->firstlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->analyticCenter).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->heuristic_effort = 0.0;
  this->dispfreq = 0;
  this->feastol = 0.0;
  this->epsilon = 0.0;
  (this->rootlpsol).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->globalOrbits).super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2> =
       (__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>)0x0;
  this->firstlpsolobj = -INFINITY;
  HighsBasis::HighsBasis(&this->firstrootbasis);
  this->rootlpsolobj = -INFINITY;
  memset(&this->numintegercols,0,0xbc);
  this->lower_bound = -INFINITY;
  this->upper_bound = INFINITY;
  this->upper_limit = INFINITY;
  this->optimality_limit = INFINITY;
  (this->nodequeue).colLowerNodesPtr =
       (__uniq_ptr_data<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete,_true,_true>
        )0x0;
  (this->nodequeue).colUpperNodesPtr =
       (__uniq_ptr_data<std::set<std::pair<double,_long>,_std::less<std::pair<double,_long>_>,_HighsNodeQueue::NodesetAllocator<std::pair<double,_long>_>_>,_HighsNodeQueue::GlobalOperatorDelete,_true,_true>
        )0x0;
  (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar1 = &(this->nodequeue).nodes;
  (pvVar1->super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pvVar1->super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 (*) [16])
   &(this->nodequeue).nodes.
    super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (undefined1  [16])0x0;
  pvVar4 = &(this->nodequeue).freeslots.c;
  (pvVar4->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar4->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined4 *)&(this->nodequeue).lowerRoot = 0xffffffff;
  *(undefined4 *)((long)&(this->nodequeue).lowerRoot + 4) = 0xffffffff;
  *(undefined4 *)&(this->nodequeue).lowerMin = 0xffffffff;
  *(undefined4 *)((long)&(this->nodequeue).lowerMin + 4) = 0xffffffff;
  *(undefined4 *)&(this->nodequeue).hybridEstimRoot = 0xffffffff;
  *(undefined4 *)((long)&(this->nodequeue).hybridEstimRoot + 4) = 0xffffffff;
  *(undefined4 *)&(this->nodequeue).hybridEstimMin = 0xffffffff;
  *(undefined4 *)((long)&(this->nodequeue).hybridEstimMin + 4) = 0xffffffff;
  *(undefined4 *)&(this->nodequeue).suboptimalRoot = 0xffffffff;
  *(undefined4 *)((long)&(this->nodequeue).suboptimalRoot + 4) = 0xffffffff;
  *(undefined4 *)&(this->nodequeue).suboptimalMin = 0xffffffff;
  *(undefined4 *)((long)&(this->nodequeue).suboptimalMin + 4) = 0xffffffff;
  (this->nodequeue).numSuboptimal = 0;
  (this->nodequeue).optimality_limit = INFINITY;
  (this->nodequeue).numCol = 0;
  HighsDomain::addCutpool(this_00,&this->cutpool);
  HighsDomain::addConflictPool(this_00,&this->conflictPool);
  return;
}

Assistant:

HighsMipSolverData(HighsMipSolver& mipsolver)
      : mipsolver(mipsolver),
        cutpool(mipsolver.numCol(), mipsolver.options_mip_->mip_pool_age_limit,
                mipsolver.options_mip_->mip_pool_soft_limit),
        conflictPool(5 * mipsolver.options_mip_->mip_pool_age_limit,
                     mipsolver.options_mip_->mip_pool_soft_limit),
        domain(mipsolver),
        lp(mipsolver),
        pseudocost(),
        cliquetable(mipsolver.numCol()),
        implications(mipsolver),
        heuristics(mipsolver),
        objectiveFunction(mipsolver),
        presolve_status(HighsPresolveStatus::kNotSet),
        cliquesExtracted(false),
        rowMatrixSet(false),
        analyticCenterComputed(false),
        analyticCenterStatus(HighsModelStatus::kNotset),
        detectSymmetries(false),
        numRestarts(0),
        numRestartsRoot(0),
        numCliqueEntriesAfterPresolve(0),
        numCliqueEntriesAfterFirstPresolve(0),
        feastol(0.0),
        epsilon(0.0),
        heuristic_effort(0.0),
        dispfreq(0),
        firstlpsolobj(-kHighsInf),
        rootlpsolobj(-kHighsInf),
        numintegercols(0),
        maxTreeSizeLog2(0),
        pruned_treeweight(0),
        avgrootlpiters(0.0),
        disptime(0.0),
        last_disptime(0.0),
        firstrootlpiters(0),
        num_nodes(0),
        num_leaves(0),
        num_leaves_before_run(0),
        num_nodes_before_run(0),
        total_repair_lp(0),
        total_repair_lp_feasible(0),
        total_repair_lp_iterations(0),
        total_lp_iterations(0),
        heuristic_lp_iterations(0),
        sepa_lp_iterations(0),
        sb_lp_iterations(0),
        total_lp_iterations_before_run(0),
        heuristic_lp_iterations_before_run(0),
        sepa_lp_iterations_before_run(0),
        sb_lp_iterations_before_run(0),
        num_disp_lines(0),
        numImprovingSols(0),
        lower_bound(-kHighsInf),
        upper_bound(kHighsInf),
        upper_limit(kHighsInf),
        optimality_limit(kHighsInf),
        debugSolution(mipsolver) {
    domain.addCutpool(cutpool);
    domain.addConflictPool(conflictPool);
  }